

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

Ref<embree::XML> embree::parseXML(Ref<embree::Stream<embree::Token>_> *cin,size_t depth)

{
  byte bVar1;
  bool bVar2;
  runtime_error *prVar3;
  Token *pTVar4;
  _func_int **pp_Var5;
  Stream<embree::Token> *this;
  Ref<embree::Stream<embree::Token>_> *in_RDX;
  XML *in_RDI;
  Ref<embree::XML> *xml;
  Token *in_stack_fffffffffffff3a8;
  Token *in_stack_fffffffffffff3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b8;
  string *in_stack_fffffffffffff3c8;
  XML *in_stack_fffffffffffff3d0;
  string *in_stack_fffffffffffff408;
  Token *in_stack_fffffffffffff418;
  undefined7 in_stack_fffffffffffff458;
  undefined1 in_stack_fffffffffffff45f;
  Stream<embree::Token> *in_stack_fffffffffffff468;
  Stream<embree::Token> *in_stack_fffffffffffff470;
  bool local_af2;
  bool local_a72;
  Ref<embree::Stream<embree::Token>_> *in_stack_fffffffffffff5c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  string local_978 [39];
  allocator local_951;
  string local_950 [183];
  undefined1 local_899;
  string local_838 [32];
  string local_818 [183];
  undefined1 local_761;
  string local_740 [39];
  allocator local_719;
  string local_718 [176];
  long *local_668;
  allocator local_659;
  string local_658 [111];
  allocator local_5e9;
  string local_5e8 [180];
  byte local_534;
  byte local_533;
  byte local_532;
  allocator local_531;
  string local_530 [111];
  allocator local_4c1;
  string local_4c0 [111];
  allocator local_451;
  string local_450 [108];
  byte local_3e4;
  byte local_3e3;
  byte local_3e2;
  allocator local_3e1;
  string local_3e0 [111];
  allocator local_371;
  string local_370 [176];
  string local_2c0 [39];
  undefined1 local_299;
  string local_278 [39];
  allocator local_251;
  string local_250 [182];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [34];
  undefined1 local_176;
  undefined1 local_175;
  string local_148 [24];
  size_t in_stack_fffffffffffffed0;
  
  if ((Ref<embree::Stream<embree::Token>_> *)0x400 < in_RDX) {
    local_175 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar4 = Stream<embree::Token>::peek(in_stack_fffffffffffff468);
    Token::Location(pTVar4);
    ParseLocation::str_abi_cxx11_
              ((ParseLocation *)CONCAT17(in_stack_fffffffffffff45f,in_stack_fffffffffffff458));
    std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
    std::runtime_error::runtime_error(prVar3,local_148);
    local_175 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_176 = 0;
  pp_Var5 = (_func_int **)::operator_new(0xb0);
  local_19a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"",&local_199);
  XML::XML(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  local_19a = 0;
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var5;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pTVar4 = Stream<embree::Token>::peek(in_stack_fffffffffffff468);
  Token::Location(pTVar4);
  ParseLocation::operator=
            ((ParseLocation *)in_stack_fffffffffffff3b0,(ParseLocation *)in_stack_fffffffffffff3a8);
  Stream<embree::Token>::get(in_stack_fffffffffffff470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"<",&local_251);
  Token::Sym(in_stack_fffffffffffff408);
  bVar1 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
  Token::~Token(in_stack_fffffffffffff3b0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  Token::~Token(in_stack_fffffffffffff3b0);
  if ((bVar1 & 1) != 0) {
    local_299 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar4 = Stream<embree::Token>::unget
                       ((Stream<embree::Token> *)in_stack_fffffffffffff3d0,
                        (size_t)in_stack_fffffffffffff3c8);
    Token::Location(pTVar4);
    ParseLocation::str_abi_cxx11_
              ((ParseLocation *)CONCAT17(in_stack_fffffffffffff45f,in_stack_fffffffffffff458));
    std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
    std::runtime_error::runtime_error(prVar3,local_278);
    local_299 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Stream<embree::Token>::get(in_stack_fffffffffffff470);
  Token::Identifier_abi_cxx11_(in_stack_fffffffffffff418);
  std::__cxx11::string::operator=((string *)((in_RDI->super_RefCount)._vptr_RefCount + 6),local_2c0)
  ;
  std::__cxx11::string::~string(local_2c0);
  Token::~Token(in_stack_fffffffffffff3b0);
  parseComments(in_stack_fffffffffffff5c8);
  while( true ) {
    local_3e2 = 0;
    local_3e3 = 0;
    local_3e4 = 0;
    Stream<embree::Token>::peek(in_stack_fffffffffffff468);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"/>",&local_371);
    Token::Sym(in_stack_fffffffffffff408);
    bVar2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    local_a72 = false;
    if (bVar2) {
      Stream<embree::Token>::peek(in_stack_fffffffffffff468);
      std::allocator<char>::allocator();
      local_3e2 = 1;
      std::__cxx11::string::string(local_3e0,">",&local_3e1);
      local_3e3 = 1;
      Token::Sym(in_stack_fffffffffffff408);
      local_3e4 = 1;
      local_a72 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    }
    if ((local_3e4 & 1) != 0) {
      Token::~Token(in_stack_fffffffffffff3b0);
    }
    if ((local_3e3 & 1) != 0) {
      std::__cxx11::string::~string(local_3e0);
    }
    if ((local_3e2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    }
    Token::~Token(in_stack_fffffffffffff3b0);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    if (local_a72 == false) break;
    parseParm((Ref<embree::Stream<embree::Token>_> *)CONCAT17(bVar1,in_stack_fffffffffffff5e0),
              in_stack_fffffffffffff5d8);
    parseComments(in_stack_fffffffffffff5c8);
  }
  Stream<embree::Token>::peek(in_stack_fffffffffffff468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"/>",&local_451);
  Token::Sym(in_stack_fffffffffffff408);
  bVar2 = operator==(in_stack_fffffffffffff3a8,(Token *)0x417a2e);
  Token::~Token(in_stack_fffffffffffff3b0);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  if (bVar2) {
    Stream<embree::Token>::drop(in_stack_fffffffffffff468);
  }
  else {
    Stream<embree::Token>::drop(in_stack_fffffffffffff468);
    parseComments(in_stack_fffffffffffff5c8);
    while( true ) {
      local_532 = 0;
      local_533 = 0;
      local_534 = 0;
      Stream<embree::Token>::peek(in_stack_fffffffffffff468);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c0,"<",&local_4c1);
      Token::Sym(in_stack_fffffffffffff408);
      bVar2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      local_af2 = false;
      if (bVar2) {
        Stream<embree::Token>::peek(in_stack_fffffffffffff468);
        std::allocator<char>::allocator();
        local_532 = 1;
        std::__cxx11::string::string(local_530,"</",&local_531);
        local_533 = 1;
        Token::Sym(in_stack_fffffffffffff408);
        local_534 = 1;
        local_af2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      }
      if ((local_534 & 1) != 0) {
        Token::~Token(in_stack_fffffffffffff3b0);
      }
      if ((local_533 & 1) != 0) {
        std::__cxx11::string::~string(local_530);
      }
      if ((local_532 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_531);
      }
      Token::~Token(in_stack_fffffffffffff3b0);
      std::__cxx11::string::~string(local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      if (local_af2 == false) break;
      Stream<embree::Token>::get(in_stack_fffffffffffff470);
      std::vector<embree::Token,_std::allocator<embree::Token>_>::push_back
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)in_stack_fffffffffffff3b0,
                 in_stack_fffffffffffff3a8);
      Token::~Token(in_stack_fffffffffffff3b0);
      parseComments(in_stack_fffffffffffff5c8);
    }
    Stream<embree::Token>::peek(in_stack_fffffffffffff468);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,"<",&local_5e9);
    Token::Sym(in_stack_fffffffffffff408);
    bVar2 = operator==(in_stack_fffffffffffff3a8,(Token *)0x418007);
    Token::~Token(in_stack_fffffffffffff3b0);
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    if (bVar2) {
      while( true ) {
        Stream<embree::Token>::peek(in_stack_fffffffffffff468);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_658,"</",&local_659);
        Token::Sym(in_stack_fffffffffffff408);
        bVar2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
        Token::~Token(in_stack_fffffffffffff3b0);
        std::__cxx11::string::~string(local_658);
        std::allocator<char>::~allocator((allocator<char> *)&local_659);
        if (!bVar2) break;
        parseXML(in_RDX,in_stack_fffffffffffffed0);
        std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::push_back
                  ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                   in_stack_fffffffffffff3b0,(value_type *)in_stack_fffffffffffff3a8);
        if (local_668 != (long *)0x0) {
          (**(code **)(*local_668 + 0x18))();
        }
        parseComments(in_stack_fffffffffffff5c8);
      }
    }
    Stream<embree::Token>::get(in_stack_fffffffffffff470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_718,"</",&local_719);
    Token::Sym(in_stack_fffffffffffff408);
    bVar1 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    Token::~Token(in_stack_fffffffffffff3b0);
    std::__cxx11::string::~string(local_718);
    std::allocator<char>::~allocator((allocator<char> *)&local_719);
    Token::~Token(in_stack_fffffffffffff3b0);
    if ((bVar1 & 1) != 0) {
      local_761 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar4 = Stream<embree::Token>::unget
                         ((Stream<embree::Token> *)in_stack_fffffffffffff3d0,
                          (size_t)in_stack_fffffffffffff3c8);
      Token::Location(pTVar4);
      ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(bVar1,in_stack_fffffffffffff458));
      std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
      std::runtime_error::runtime_error(prVar3,local_740);
      local_761 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get(in_stack_fffffffffffff470);
    std::__cxx11::string::string(local_818,(string *)((in_RDI->super_RefCount)._vptr_RefCount + 6));
    Token::Id(in_stack_fffffffffffff408);
    bVar2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    Token::~Token(in_stack_fffffffffffff3b0);
    std::__cxx11::string::~string(local_818);
    Token::~Token(in_stack_fffffffffffff3b0);
    if (bVar2) {
      local_899 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar4 = Stream<embree::Token>::unget
                         ((Stream<embree::Token> *)in_stack_fffffffffffff3d0,
                          (size_t)in_stack_fffffffffffff3c8);
      Token::Location(pTVar4);
      ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(bVar1,in_stack_fffffffffffff458));
      std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
      std::operator+(in_stack_fffffffffffff3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff3b0);
      std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
      std::runtime_error::runtime_error(prVar3,local_838);
      local_899 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get(in_stack_fffffffffffff470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_950,">",&local_951);
    Token::Sym(in_stack_fffffffffffff408);
    bVar2 = operator!=(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    Token::~Token(in_stack_fffffffffffff3b0);
    std::__cxx11::string::~string(local_950);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
    Token::~Token(in_stack_fffffffffffff3b0);
    if (bVar2) {
      this = (Stream<embree::Token> *)__cxa_allocate_exception(0x10);
      pTVar4 = Stream<embree::Token>::unget(this,(size_t)in_stack_fffffffffffff3c8);
      Token::Location(pTVar4);
      ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(bVar1,in_stack_fffffffffffff458));
      std::operator+(in_stack_fffffffffffff3b8,(char *)in_stack_fffffffffffff3b0);
      std::runtime_error::runtime_error((runtime_error *)this,local_978);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (Ref<embree::XML>)in_RDI;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<Token> >& cin, size_t depth)
  {
    if (depth > 1024)
      THROW_RUNTIME_ERROR(cin->peek().Location().str()+": maximal nesting depth reached");
      
    Ref<XML> xml = new XML;
    xml->loc = cin->peek().Location();

    /* parse tag opening */
    if (cin->get() != Token::Sym("<")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": tag expected");

    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("/>") && cin->peek() != Token::Sym(">")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    if (cin->peek() == Token::Sym("/>")) {
      cin->drop();
      return xml;
    }
    cin->drop();

    /* parse body token list */
    parseComments(cin);
    while (cin->peek() != Token::Sym("<") && cin->peek() != Token::Sym("</")) {
      xml->body.push_back(cin->get());
      parseComments(cin);
    }

    /* the body also contains children */
    if (cin->peek() == Token::Sym("<")) {
      while (cin->peek() != Token::Sym("</")) {
        xml->children.push_back(parseXML(cin,depth+1));
        parseComments(cin);
      }
    }

    /* parse tag closing */
    if (cin->get() != Token::Sym("</")    ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"</\" expected");
    if (cin->get() != Token::Id(xml->name)) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": closing "+xml->name+" expected");
    if (cin->get() != Token::Sym(">")     ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \">\" expected");

    return xml;
  }